

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# storage.hpp
# Opt level: O1

_storage<eggs::variants::detail::pack<eggs::variants::detail::empty,_ParserSuccess,_llvm_vecsmall::SmallVector<ParserError,_1U>_>,_false,_true>
* __thiscall
eggs::variants::detail::
_storage<eggs::variants::detail::pack<eggs::variants::detail::empty,_ParserSuccess,_llvm_vecsmall::SmallVector<ParserError,_1U>_>,_false,_true>
::operator=(_storage<eggs::variants::detail::pack<eggs::variants::detail::empty,_ParserSuccess,_llvm_vecsmall::SmallVector<ParserError,_1U>_>,_false,_true>
            *this,_storage<eggs::variants::detail::pack<eggs::variants::detail::empty,_ParserSuccess,_llvm_vecsmall::SmallVector<ParserError,_1U>_>,_false,_true>
                  *rhs)

{
  ulong uVar1;
  char *__function;
  
  uVar1 = (this->
          super__storage<eggs::variants::detail::pack<eggs::variants::detail::empty,_ParserSuccess,_llvm_vecsmall::SmallVector<ParserError,_1U>_>,_true,_true>
          )._which;
  if (uVar1 == (rhs->
               super__storage<eggs::variants::detail::pack<eggs::variants::detail::empty,_ParserSuccess,_llvm_vecsmall::SmallVector<ParserError,_1U>_>,_true,_true>
               )._which) {
    if (2 < uVar1) {
      __function = 
      "static int eggs::variants::detail::visitor<eggs::variants::detail::move_assign, void (void *, void *)>::_assert_in_range_failure(std::size_t, std::size_t) [F = eggs::variants::detail::move_assign, Sig = void (void *, void *)]"
      ;
LAB_001a2bad:
      __assert_fail("index < size && \"discriminator out of range\"",
                    "/workspace/llm4binary/github/license_all_cmakelists_1510/AndroidModLoader[P]gta3sc/deps/variant/include/eggs/variant/detail/visitor.hpp"
                    ,0x36,__function);
    }
    (*visitor<eggs::variants::detail::move_assign,_void_(void_*,_void_*)>::
      _table<eggs::variants::detail::empty,_ParserSuccess,_llvm_vecsmall::SmallVector<ParserError,_1U>_>
      ::value[uVar1])(this,rhs);
  }
  else {
    (this->
    super__storage<eggs::variants::detail::pack<eggs::variants::detail::empty,_ParserSuccess,_llvm_vecsmall::SmallVector<ParserError,_1U>_>,_true,_true>
    )._which = 0;
    uVar1 = (rhs->
            super__storage<eggs::variants::detail::pack<eggs::variants::detail::empty,_ParserSuccess,_llvm_vecsmall::SmallVector<ParserError,_1U>_>,_true,_true>
            )._which;
    if (2 < uVar1) {
      __function = 
      "static int eggs::variants::detail::visitor<eggs::variants::detail::move_construct, void (void *, void *)>::_assert_in_range_failure(std::size_t, std::size_t) [F = eggs::variants::detail::move_construct, Sig = void (void *, void *)]"
      ;
      goto LAB_001a2bad;
    }
    (*visitor<eggs::variants::detail::move_construct,_void_(void_*,_void_*)>::
      _table<eggs::variants::detail::empty,_ParserSuccess,_llvm_vecsmall::SmallVector<ParserError,_1U>_>
      ::value[uVar1])(this,rhs);
    (this->
    super__storage<eggs::variants::detail::pack<eggs::variants::detail::empty,_ParserSuccess,_llvm_vecsmall::SmallVector<ParserError,_1U>_>,_true,_true>
    )._which = (rhs->
               super__storage<eggs::variants::detail::pack<eggs::variants::detail::empty,_ParserSuccess,_llvm_vecsmall::SmallVector<ParserError,_1U>_>,_true,_true>
               )._which;
  }
  return this;
}

Assistant:

EGGS_CXX11_NOEXCEPT_IF(all_of<pack<
                std::is_nothrow_move_assignable<Ts>...
              , std::is_nothrow_move_constructible<Ts>...
            >>::value)
#endif
        {
            if (_which == rhs._which)
            {
                detail::move_assign{}(
                    pack<Ts...>{}, _which
                  , target(), rhs.target()
                );
            } else {
                _which = 0;

                detail::move_construct{}(
                    pack<Ts...>{}, rhs._which
                  , target(), rhs.target()
                );
                _which = rhs._which;
            }
            return *this;
        }